

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void rotateParams(void)

{
  float fVar1;
  double dVar2;
  reference pvVar3;
  float local_74;
  float local_6c;
  float local_64;
  int local_60;
  int c;
  float integrand;
  int theta_i;
  float sin_phi;
  int phi_i;
  int shapeIndex;
  int param;
  float d_theta;
  float d_phi;
  int baseIndex;
  float newParams [9];
  Perf local_9 [8];
  Perf stat;
  
  Perf::Perf(local_9,"Rotate params");
  newParams[2] = 0.0;
  newParams[3] = 0.0;
  newParams[4] = 0.0;
  newParams[5] = 0.0;
  _d_phi = 0;
  newParams[0] = 0.0;
  newParams[1] = 0.0;
  newParams[6] = 0.0;
  d_theta = 0.0;
  local_64 = (float)phi_n;
  local_6c = (float)theta_n;
  for (phi_i = 0; phi_i < 9; phi_i = phi_i + 1) {
    sin_phi = 0.0;
    for (theta_i = 0; (ulong)(long)theta_i <= phi_n; theta_i = theta_i + 1) {
      local_74 = (float)phi_n;
      dVar2 = std::sin((double)(ulong)(uint)(((float)theta_i * 3.1415927) / local_74));
      for (c = 0; (ulong)(long)c < theta_n; c = c + 1) {
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&legendre_scalars,(long)((int)d_theta + (int)sin_phi + c));
        fVar1 = *pvVar3;
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&shape_scalars,(long)((int)sin_phi + c + 1));
        (&d_phi)[phi_i] =
             fVar1 * *pvVar3 * (3.1415927 / local_64) * (6.2831855 / local_6c) * SUB84(dVar2,0) +
             (&d_phi)[phi_i];
      }
      sin_phi = (float)((int)sin_phi + (int)theta_n + 1);
    }
    d_theta = (float)((int)sin_phi + (int)d_theta);
  }
  for (local_60 = 0; local_60 < 9; local_60 = local_60 + 1) {
    legendre_params[local_60] = (&d_phi)[local_60] * 3.1415927;
  }
  regenerateBuffer();
  return;
}

Assistant:

void rotateParams() {
    Perf stat("Rotate params");
    float newParams[9] = {0,0,0,0,0,0,0,0,0};

    int baseIndex = 0;
    float d_phi = float(M_PI) / phi_n;
    float d_theta = 2 * float(M_PI) / theta_n;
    for (int param = 0; param < 9; param++) {
        int shapeIndex = 0;
        for (int phi_i = 0; phi_i <= phi_n; phi_i++) {
            float sin_phi = sin(float(M_PI) * phi_i / phi_n);
            for (int theta_i = 0; theta_i < theta_n; theta_i++) {
                float integrand = legendre_scalars[baseIndex + shapeIndex + theta_i] * shape_scalars[shapeIndex + theta_i + 1]; // doesn't overflow because there's an extra on the end
                newParams[param] += integrand * d_phi * d_theta * sin_phi;
            }
            shapeIndex += theta_n + 1;
        }
        baseIndex += shapeIndex;
    }

    for (int c = 0; c < 9; c++) {
        legendre_params[c] = newParams[c] * M_PI; // For some reason it's off by a factor of M_PI. TODO: figure out why
    }

    regenerateBuffer();
}